

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int source_get_durable(SOURCE_HANDLE source,terminus_durability *durable_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  SOURCE_INSTANCE *source_instance;
  uint32_t item_count;
  int result;
  terminus_durability *durable_value_local;
  SOURCE_HANDLE source_local;
  
  if (source == (SOURCE_HANDLE)0x0) {
    source_instance._4_4_ = 0x30ae;
  }
  else {
    _item_count = durable_value;
    durable_value_local = (terminus_durability *)source;
    iVar1 = amqpvalue_get_composite_item_count(source->composite_value,(uint32_t *)&source_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)source_instance < 2) {
        *_item_count = 0;
        source_instance._4_4_ = 0;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(source->composite_value,1);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          *_item_count = 0;
          source_instance._4_4_ = 0;
        }
        else {
          iVar1 = amqpvalue_get_uint(value,_item_count);
          if (iVar1 == 0) {
            source_instance._4_4_ = 0;
          }
          else {
            AVar2 = amqpvalue_get_type(value);
            if (AVar2 == AMQP_TYPE_NULL) {
              *_item_count = 0;
              source_instance._4_4_ = 0;
            }
            else {
              source_instance._4_4_ = 0x30cf;
            }
          }
        }
      }
    }
    else {
      source_instance._4_4_ = 0x30b6;
    }
  }
  return source_instance._4_4_;
}

Assistant:

int source_get_durable(SOURCE_HANDLE source, terminus_durability* durable_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        if (amqpvalue_get_composite_item_count(source_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 1)
            {
                *durable_value = terminus_durability_none;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(source_instance->composite_value, 1);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *durable_value = terminus_durability_none;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_terminus_durability(item_value, durable_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *durable_value = terminus_durability_none;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}